

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.h
# Opt level: O3

void __thiscall kj::Vector<capnp::Schema>::setCapacity(Vector<capnp::Schema> *this,size_t newSize)

{
  Schema *pSVar1;
  RemoveConst<capnp::Schema> *pRVar2;
  Schema *pSVar3;
  size_t __n;
  ArrayBuilder<capnp::Schema> local_38;
  
  pSVar1 = (this->builder).ptr;
  if (newSize < (ulong)((long)(this->builder).pos - (long)pSVar1 >> 3)) {
    (this->builder).pos = pSVar1 + newSize;
  }
  pSVar3 = (Schema *)
           kj::_::HeapArrayDisposer::allocateImpl
                     (8,0,newSize,(_func_void_void_ptr *)0x0,(_func_void_void_ptr *)0x0);
  local_38.endPtr = pSVar3 + newSize;
  local_38.disposer = (ArrayDisposer *)&kj::_::HeapArrayDisposer::instance;
  pSVar1 = (this->builder).ptr;
  __n = (long)(this->builder).pos - (long)pSVar1;
  local_38.ptr = pSVar3;
  if (__n != 0) {
    memcpy(pSVar3,pSVar1,__n);
  }
  local_38.pos = (RemoveConst<capnp::Schema> *)((long)pSVar3 + __n);
  ArrayBuilder<capnp::Schema>::operator=(&this->builder,&local_38);
  pSVar3 = local_38.endPtr;
  pRVar2 = local_38.pos;
  pSVar1 = local_38.ptr;
  if (local_38.ptr != (Schema *)0x0) {
    local_38.ptr = (Schema *)0x0;
    local_38.pos = (RemoveConst<capnp::Schema> *)0x0;
    local_38.endPtr = (Schema *)0x0;
    (**(local_38.disposer)->_vptr_ArrayDisposer)
              (local_38.disposer,pSVar1,8,(long)pRVar2 - (long)pSVar1 >> 3,
               (long)pSVar3 - (long)pSVar1 >> 3,0);
  }
  return;
}

Assistant:

void setCapacity(size_t newSize) {
    if (builder.size() > newSize) {
      builder.truncate(newSize);
    }
    ArrayBuilder<T> newBuilder = heapArrayBuilder<T>(newSize);
    newBuilder.addAll(kj::mv(builder));
    builder = kj::mv(newBuilder);
  }